

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O1

nng_err nni_http_init(nng_http **connp,nng_stream *stream,_Bool client)

{
  bool bVar1;
  int iVar2;
  nni_http_conn *conn;
  uint8_t *puVar3;
  long lVar4;
  char *__s2;
  nng_err nVar5;
  
  conn = (nni_http_conn *)nni_zalloc(0x8e8);
  nVar5 = NNG_ENOMEM;
  if (conn == (nni_http_conn *)0x0) {
    bVar1 = false;
  }
  else {
    conn->client = client;
    nni_mtx_init(&conn->mtx);
    nni_aio_list_init(&conn->rdq);
    nni_aio_list_init(&conn->wrq);
    nni_http_req_init(&conn->req);
    nni_http_res_init(&conn->res);
    lVar4 = 1;
    __s2 = "HTTP/1.1";
    do {
      iVar2 = strcmp("HTTP/1.1",__s2);
      if (iVar2 == 0) {
        conn->vers = __s2;
        break;
      }
      __s2 = nni_http_set_version::http_versions[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 6);
    builtin_strncpy(conn->meth,"GET",4);
    puVar3 = (uint8_t *)nni_alloc(0x1fe0);
    conn->buf = puVar3;
    if (puVar3 == (uint8_t *)0x0) {
      nni_http_conn_fini(conn);
      bVar1 = false;
      nVar5 = NNG_ENOMEM;
    }
    else {
      conn->bufsz = 0x1fe0;
      nni_aio_init(&conn->wr_aio,http_wr_cb,conn);
      nni_aio_init(&conn->rd_aio,http_rd_cb,conn);
      conn->sock = stream;
      *connp = conn;
      nVar5 = NNG_OK;
      bVar1 = true;
    }
  }
  if (!bVar1) {
    nng_stream_free(stream);
  }
  return nVar5;
}

Assistant:

static nng_err
http_init(nni_http_conn **connp, nng_stream *data, bool client)
{
	nni_http_conn *conn;

	if ((conn = NNI_ALLOC_STRUCT(conn)) == NULL) {
		return (NNG_ENOMEM);
	}
	conn->client = client;
	nni_mtx_init(&conn->mtx);
	nni_aio_list_init(&conn->rdq);
	nni_aio_list_init(&conn->wrq);
	nni_http_req_init(&conn->req);
	nni_http_res_init(&conn->res);
	nni_http_set_version(conn, NNG_HTTP_VERSION_1_1);
	nni_http_set_method(conn, "GET");

	if ((conn->buf = nni_alloc(HTTP_BUFSIZE)) == NULL) {
		nni_http_conn_fini(conn);
		return (NNG_ENOMEM);
	}
	conn->bufsz = HTTP_BUFSIZE;

	nni_aio_init(&conn->wr_aio, http_wr_cb, conn);
	nni_aio_init(&conn->rd_aio, http_rd_cb, conn);

	conn->sock = data;

	*connp = conn;

	return (NNG_OK);
}